

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<bool,_8UL> * __thiscall
spirv_cross::SmallVector<bool,_8UL>::operator=
          (SmallVector<bool,_8UL> *this,SmallVector<bool,_8UL> *other)

{
  bool *pbVar1;
  bool *pbVar2;
  ulong local_20;
  size_t i;
  SmallVector<bool,_8UL> *other_local;
  SmallVector<bool,_8UL> *this_local;
  
  clear(this);
  pbVar1 = (other->super_VectorView<bool>).ptr;
  pbVar2 = AlignedBuffer<bool,_8UL>::data(&other->stack_storage);
  if (pbVar1 == pbVar2) {
    reserve(this,(other->super_VectorView<bool>).buffer_size);
    for (local_20 = 0; local_20 < (other->super_VectorView<bool>).buffer_size;
        local_20 = local_20 + 1) {
      (this->super_VectorView<bool>).ptr[local_20] =
           (bool)((other->super_VectorView<bool>).ptr[local_20] & 1);
    }
    (this->super_VectorView<bool>).buffer_size = (other->super_VectorView<bool>).buffer_size;
    (other->super_VectorView<bool>).buffer_size = 0;
  }
  else {
    pbVar1 = (this->super_VectorView<bool>).ptr;
    pbVar2 = AlignedBuffer<bool,_8UL>::data(&this->stack_storage);
    if (pbVar1 != pbVar2) {
      free((this->super_VectorView<bool>).ptr);
    }
    (this->super_VectorView<bool>).ptr = (other->super_VectorView<bool>).ptr;
    (this->super_VectorView<bool>).buffer_size = (other->super_VectorView<bool>).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->super_VectorView<bool>).ptr = (bool *)0x0;
    (other->super_VectorView<bool>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}